

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

SUNErrCode SMScaleAddNew_Band(sunrealtype c,SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  SUNMatrix p_Var4;
  long lVar5;
  long *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  SUNMatrix C;
  sunrealtype *C_colj;
  sunrealtype *B_colj;
  sunrealtype *A_colj;
  sunindextype smu;
  sunindextype mu;
  sunindextype ml;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  sunindextype local_80;
  long local_78;
  long local_70;
  SUNContext_conflict in_stack_ffffffffffffffa0;
  sunindextype in_stack_ffffffffffffffa8;
  sunindextype in_stack_ffffffffffffffb0;
  long local_30;
  long local_28;
  
  if (*(long *)(*in_RSI + 0x20) < *(long *)(*in_RDI + 0x20)) {
    local_70 = *(long *)(*in_RDI + 0x20);
  }
  else {
    local_70 = *(long *)(*in_RSI + 0x20);
  }
  if (*(long *)(*in_RSI + 0x18) < *(long *)(*in_RDI + 0x18)) {
    local_78 = *(long *)(*in_RDI + 0x18);
  }
  else {
    local_78 = *(long *)(*in_RSI + 0x18);
  }
  if (*(long *)(*in_RDI + 8) + -1 < local_78 + local_70) {
    local_80 = *(long *)(*in_RDI + 8) + -1;
  }
  else {
    local_80 = local_78 + local_70;
  }
  p_Var4 = SUNBandMatrixStorage
                     (local_78,local_80,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                      in_stack_ffffffffffffffa0);
  for (local_30 = 0; local_30 < *(long *)(*in_RDI + 8); local_30 = local_30 + 1) {
    lVar1 = *(long *)(*(long *)(*in_RDI + 0x40) + local_30 * 8);
    lVar2 = *(long *)(*in_RDI + 0x28);
    lVar5 = *(long *)(*(long *)((long)p_Var4->content + 0x40) + local_30 * 8);
    lVar3 = *(long *)((long)p_Var4->content + 0x28);
    for (local_28 = -*(long *)(*in_RDI + 0x18); local_28 <= *(long *)(*in_RDI + 0x20);
        local_28 = local_28 + 1) {
      *(double *)(lVar5 + lVar3 * 8 + local_28 * 8) =
           in_XMM0_Qa * *(double *)(lVar1 + lVar2 * 8 + local_28 * 8);
    }
  }
  for (local_30 = 0; local_30 < *(long *)(*in_RSI + 8); local_30 = local_30 + 1) {
    lVar1 = *(long *)(*(long *)(*in_RSI + 0x40) + local_30 * 8);
    lVar2 = *(long *)(*in_RSI + 0x28);
    lVar5 = *(long *)(*(long *)((long)p_Var4->content + 0x40) + local_30 * 8) +
            *(long *)((long)p_Var4->content + 0x28) * 8;
    for (local_28 = -*(long *)(*in_RSI + 0x18); local_28 <= *(long *)(*in_RSI + 0x20);
        local_28 = local_28 + 1) {
      *(double *)(lVar5 + local_28 * 8) =
           *(double *)(lVar1 + lVar2 * 8 + local_28 * 8) + *(double *)(lVar5 + local_28 * 8);
    }
  }
  free(*(void **)(*in_RDI + 0x30));
  *(undefined8 *)(*in_RDI + 0x30) = 0;
  free(*(void **)(*in_RDI + 0x40));
  *(undefined8 *)(*in_RDI + 0x40) = 0;
  free((void *)*in_RDI);
  *in_RDI = 0;
  *in_RDI = (long)p_Var4->content;
  p_Var4->content = (void *)0x0;
  SUNMatDestroy_Band((SUNMatrix)0x18969a);
  return 0;
}

Assistant:

SUNErrCode SMScaleAddNew_Band(sunrealtype c, SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j, ml, mu, smu;
  sunrealtype *A_colj, *B_colj, *C_colj;
  SUNMatrix C;

  /* create new matrix large enough to hold both A and B */
  ml  = SUNMAX(SM_LBAND_B(A), SM_LBAND_B(B));
  mu  = SUNMAX(SM_UBAND_B(A), SM_UBAND_B(B));
  smu = SUNMIN(SM_COLUMNS_B(A) - 1, mu + ml);
  C   = SUNBandMatrixStorage(SM_COLUMNS_B(A), mu, ml, smu, A->sunctx);
  SUNCheckLastErr();

  /* scale/add c*A into new matrix */
  for (j = 0; j < SM_COLUMNS_B(A); j++)
  {
    A_colj = SM_COLUMN_B(A, j);
    C_colj = SM_COLUMN_B(C, j);
    for (i = -SM_UBAND_B(A); i <= SM_LBAND_B(A); i++)
    {
      C_colj[i] = c * A_colj[i];
    }
  }

  /* add B into new matrix */
  for (j = 0; j < SM_COLUMNS_B(B); j++)
  {
    B_colj = SM_COLUMN_B(B, j);
    C_colj = SM_COLUMN_B(C, j);
    for (i = -SM_UBAND_B(B); i <= SM_LBAND_B(B); i++)
    {
      C_colj[i] += B_colj[i];
    }
  }

  /* replace A contents with C contents, nullify C content pointer, destroy C */
  free(SM_DATA_B(A));
  SM_DATA_B(A) = NULL;
  free(SM_COLS_B(A));
  SM_COLS_B(A) = NULL;
  free(A->content);
  A->content = NULL;
  A->content = C->content;
  C->content = NULL;
  SUNMatDestroy_Band(C);

  return SUN_SUCCESS;
}